

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pBuffer,MAP_TYPE MapType)

{
  bool bVar1;
  int iVar2;
  Char *pCVar3;
  undefined4 extraout_var;
  pointer ppVar4;
  char (*in_R8) [23];
  MAP_TYPE *in_R9;
  undefined1 local_a0 [8];
  string msg_2;
  string msg_1;
  _Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
  local_58;
  iterator MappedBufferIt;
  undefined1 local_40 [8];
  string msg;
  IBuffer *pIStack_18;
  MAP_TYPE MapType_local;
  IBuffer *pBuffer_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xf] = MapType;
  pIStack_18 = pBuffer;
  pBuffer_local = (IBuffer *)this;
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[25]>((string *)local_40,(char (*) [25])0xf4e9c6);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x720);
    std::__cxx11::string::~string((string *)local_40);
  }
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
       ::find(&this->m_DbgMappedBuffers,&stack0xffffffffffffffe8);
  msg_1.field_2._8_8_ =
       std::
       unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
       ::end(&this->m_DbgMappedBuffers);
  bVar1 = std::__detail::operator!=
                    (&local_58,
                     (_Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
                      *)((long)&msg_1.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    iVar2 = (*(pIStack_18->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    FormatString<char[9],char_const*,char[23]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)0xe50594,
               (char (*) [9])CONCAT44(extraout_var,iVar2),(char **)"\' has not been mapped.",in_R8);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x724);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false,_false>
           ::operator->((_Node_iterator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false,_false>
                         *)&local_58);
  if ((ppVar4->second).MapType != msg.field_2._M_local_buf[0xf]) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false,_false>
             ::operator->((_Node_iterator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false,_false>
                           *)&local_58);
    FormatString<char[10],Diligent::MAP_TYPE,char[63],Diligent::MAP_TYPE>
              ((string *)local_a0,(Diligent *)"MapType (",(char (*) [10])((long)&msg.field_2 + 0xf),
               (MAP_TYPE *)") does not match the map type that was used to map the buffer ",
               (char (*) [63])&ppVar4->second,in_R9);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x725);
    std::__cxx11::string::~string((string *)local_a0);
  }
  std::
  unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
  ::erase(&this->m_DbgMappedBuffers,(iterator)local_58._M_cur);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UnmapBuffer(IBuffer* pBuffer, MAP_TYPE MapType)
{
    VERIFY(pBuffer, "pBuffer must not be null");
#ifdef DILIGENT_DEBUG
    {
        auto MappedBufferIt = m_DbgMappedBuffers.find(pBuffer);
        VERIFY(MappedBufferIt != m_DbgMappedBuffers.end(), "Buffer '", pBuffer->GetDesc().Name, "' has not been mapped.");
        VERIFY(MappedBufferIt->second.MapType == MapType, "MapType (", MapType, ") does not match the map type that was used to map the buffer ", MappedBufferIt->second.MapType);
        m_DbgMappedBuffers.erase(MappedBufferIt);
    }
#endif
}